

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

SortNode * __thiscall GLDrawList::SortSpriteList(GLDrawList *this,SortNode *head)

{
  SortNode *pSVar1;
  SortNode **ppSVar2;
  ulong uVar3;
  ulong uVar4;
  SortNode *pSVar5;
  
  if (SortSpriteList(SortNode*)::sortspritelist == '\0') {
    SortSpriteList();
  }
  pSVar5 = head->parent;
  if (SortSpriteList::sortspritelist.Count != 0) {
    SortSpriteList::sortspritelist.Count = 0;
  }
  do {
    TArray<SortNode_*,_SortNode_*>::Grow(&SortSpriteList::sortspritelist,1);
    SortSpriteList::sortspritelist.Array[SortSpriteList::sortspritelist.Count] = head;
    SortSpriteList::sortspritelist.Count = SortSpriteList::sortspritelist.Count + 1;
    head = head->next;
  } while (head != (SortNode *)0x0);
  gd = this;
  qsort(SortSpriteList::sortspritelist.Array,(ulong)SortSpriteList::sortspritelist.Count,8,
        CompareSprite);
  ppSVar2 = SortSpriteList::sortspritelist.Array;
  uVar3 = (ulong)SortSpriteList::sortspritelist.Count;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      ppSVar2[uVar4]->next = (SortNode *)0x0;
      pSVar1 = ppSVar2[uVar4];
      if (pSVar5 != (SortNode *)0x0) {
        pSVar5->equal = pSVar1;
      }
      uVar4 = uVar4 + 1;
      pSVar5 = pSVar1;
    } while (uVar3 != uVar4);
  }
  return *ppSVar2;
}

Assistant:

SortNode * GLDrawList::SortSpriteList(SortNode * head)
{
	SortNode * n;
	int count;
	unsigned i;

	static TArray<SortNode*> sortspritelist;

	SortNode * parent=head->parent;

	sortspritelist.Clear();
	for(count=0,n=head;n;n=n->next) sortspritelist.Push(n);
	gd=this;
	qsort(&sortspritelist[0],sortspritelist.Size(),sizeof(SortNode *),CompareSprite);
	for(i=0;i<sortspritelist.Size();i++)
	{
		sortspritelist[i]->next=NULL;
		if (parent) parent->equal=sortspritelist[i];
		parent=sortspritelist[i];
	}
	return sortspritelist[0];
}